

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtooltip.cpp
# Opt level: O0

void __thiscall QTipLabel::reuseTip(QTipLabel *this,QString *text,int msecDisplayTime,QPoint *pos)

{
  QLabel *in_RCX;
  offset_in_QTipLabel_to_subr in_RSI;
  QTipLabel *in_RDI;
  offset_in_QObject_to_subr unaff_retaddr;
  code *in_stack_ffffffffffffffd0;
  QTipLabel *in_stack_ffffffffffffffd8;
  int msecDisplayTime_00;
  QTipLabel *this_00;
  
  this_00 = in_RDI;
  if (in_RDI->styleSheetParent != (QWidget *)0x0) {
    in_stack_ffffffffffffffd0 = QObject::destroyed;
    in_stack_ffffffffffffffd8 = (QTipLabel *)0x0;
    QObject::disconnect<void(QObject::*)(QObject*),void(QTipLabel::*)()>
              ((Object *)0x0,unaff_retaddr,(Object *)styleSheetParentDestroyed,in_RSI);
    in_RDI->styleSheetParent = (QWidget *)0x0;
  }
  msecDisplayTime_00 = (int)(in_RSI >> 0x20);
  QLabel::setText(in_RCX,(QString *)in_stack_ffffffffffffffd8);
  updateSize(in_stack_ffffffffffffffd8,(QPoint *)in_stack_ffffffffffffffd0);
  restartExpireTimer(this_00,msecDisplayTime_00);
  return;
}

Assistant:

void QTipLabel::reuseTip(const QString &text, int msecDisplayTime, const QPoint &pos)
{
#ifndef QT_NO_STYLE_STYLESHEET
    if (styleSheetParent){
        disconnect(styleSheetParent, &QWidget::destroyed,
                   this, &QTipLabel::styleSheetParentDestroyed);
        styleSheetParent = nullptr;
    }
#endif

    setText(text);
    updateSize(pos);
    restartExpireTimer(msecDisplayTime);
}